

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_base.h
# Opt level: O2

bool __thiscall
LineBase2D<double>::intersection
          (LineBase2D<double> *this,LineBase2D<double> *line,PointBase2D<double> *point)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double denominator;
  double local_28;
  double local_20;
  
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (this->_direction).y;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (line->_direction).x;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (line->_direction).y * (this->_direction).x;
  auVar1 = vfmsub231sd_fma(auVar8,auVar7,auVar1);
  local_20 = 0.0;
  local_28 = auVar1._0_8_;
  bVar6 = pvmath::isEqual<double>(&local_28,&local_20,10.0);
  if (!bVar6) {
    dVar3 = (this->_position).x;
    dVar4 = (this->_position).y;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (line->_direction).y;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar3 - (line->_position).x;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = ((this->_position).y - (line->_position).y) * (line->_direction).x;
    auVar1 = vfmsub231sd_fma(auVar10,auVar9,auVar2);
    local_28 = auVar1._0_8_ / local_28;
    dVar5 = (this->_direction).y;
    point->x = dVar3 + local_28 * (this->_direction).x;
    point->y = dVar4 + local_28 * dVar5;
  }
  return !bVar6;
}

Assistant:

bool intersection( const LineBase2D & line, PointBase2D<_Type> & point ) const
    {
        // based on Graphics Gems III, Faster Line Segment Intersection, p. 199-202
        // http://www.realtimerendering.com/resources/GraphicsGems/gems.html#gemsiii
        const _Type denominator = _direction.y * line._direction.x - _direction.x * line._direction.y;
        if ( pvmath::isEqual<_Type>( denominator, 0, 10 ) )
            return false; // they are parallel

        const PointBase2D<_Type> offset = _position - line._position;
        const _Type na = (line._direction.y * offset.x - line._direction.x * offset.y) / denominator;
        point = _position + PointBase2D<_Type>( _direction.x * na, _direction.y * na );
        return true;
    }